

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O3

uint lsh::vector::distance(vector *u,vector *v)

{
  pointer puVar1;
  uint uVar2;
  ulong uVar3;
  invalid_argument *this;
  ulong uVar4;
  uint uVar5;
  
  if (u->size_ != v->size_) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Invalid vector size");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  puVar1 = (u->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)((long)(u->components_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1) >> 2;
  if ((int)uVar3 == 0) {
    uVar2 = 0;
  }
  else {
    uVar4 = 0;
    uVar2 = 0;
    do {
      uVar5 = (v->components_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar4] ^ puVar1[uVar4];
      uVar5 = uVar5 - (uVar5 >> 1 & 0x55555555);
      uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
      uVar2 = uVar2 + (((uVar5 >> 4) + uVar5 & 0xf0f0f0f) * 0x1010101 >> 0x18);
      uVar4 = uVar4 + 1;
    } while ((uVar3 & 0xffffffff) != uVar4);
  }
  return uVar2;
}

Assistant:

unsigned int vector::size() const {
    return this->size_;
  }